

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O1

void Image_Function::GammaCorrection
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,double a,double gamma)

{
  undefined1 (*pauVar1) [64];
  imageException *this;
  uint16_t i;
  long lVar2;
  undefined1 auVar3 [64];
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  vector<unsigned_char,_std::allocator<unsigned_char>_> value;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  if ((0.0 <= a) && (0.0 <= gamma)) {
    auVar6 = ZEXT864(0) << 0x40;
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pauVar1 = (undefined1 (*) [64])operator_new(0x100);
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(pauVar1 + 4);
    auVar3 = vpternlogd_avx512f(auVar6,auVar6,auVar6,0xff);
    auVar6 = vmovdqu64_avx512f(auVar3);
    pauVar1[3] = auVar6;
    auVar6 = vmovdqu64_avx512f(auVar3);
    pauVar1[2] = auVar6;
    auVar6 = vmovdqu64_avx512f(auVar3);
    pauVar1[1] = auVar6;
    auVar6 = vmovdqu64_avx512f(auVar3);
    *pauVar1 = auVar6;
    lVar2 = 0;
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pauVar1;
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    do {
      dVar4 = pow((double)(int)(short)lVar2 / 255.0,gamma);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dVar4 * a;
      auVar5 = vfmadd213sd_fma(auVar5,ZEXT816(0x406fe00000000000),ZEXT816(0x3fe0000000000000));
      if (auVar5._0_8_ < 256.0) {
        (*pauVar1)[lVar2] = (char)(int)auVar5._0_8_;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x100);
    LookupTable(in,startXIn,startYIn,out,startXOut,startYOut,width,height,&value);
    operator_delete(pauVar1);
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Gamma correction parameters are invalid");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void GammaCorrection( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                          uint32_t width, uint32_t height, double a, double gamma )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );

        if( a < 0 || gamma < 0 )
            throw imageException( "Gamma correction parameters are invalid" );

        // We precalculate all values and store them in lookup table
        std::vector < uint8_t > value( 256, 255u );

        for( uint16_t i = 0; i < 256; ++i ) {
            double data = a * pow( i / 255.0, gamma ) * 255 + 0.5;

            if( data < 256 )
                value[i] = static_cast<uint8_t>(data);
        }

        LookupTable( in, startXIn, startYIn, out, startXOut, startYOut, width, height, value );
    }